

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O0

void auto_commit_test(void)

{
  int iVar1;
  size_t sVar2;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  size_t valuelen;
  void *value_out;
  char value [256];
  char key [256];
  fdb_status status;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_kvs_handle *in_stack_fffffffffffffc28;
  fdb_file_handle *in_stack_fffffffffffffc30;
  void **ppvVar3;
  fdb_kvs_handle *in_stack_fffffffffffffc48;
  void **in_stack_fffffffffffffc50;
  size_t in_stack_fffffffffffffc58;
  char *in_stack_fffffffffffffc60;
  fdb_kvs_handle *in_stack_fffffffffffffc68;
  size_t local_288;
  void *local_280;
  char local_278 [192];
  fdb_config *in_stack_fffffffffffffe48;
  char *in_stack_fffffffffffffe50;
  fdb_file_handle **in_stack_fffffffffffffe58;
  void *local_178 [32];
  fdb_status local_74;
  fdb_kvs_handle *local_70;
  int local_5c;
  int local_58;
  uint local_54;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  memleak_start();
  local_5c = 5000;
  local_58 = system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  local_74 = fdb_open(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48)
  ;
  if (local_74 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0xed2);
    auto_commit_test::__test_pass = 0;
    if (local_74 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xed2,"void auto_commit_test()");
    }
  }
  local_74 = fdb_kvs_open_default
                       (in_stack_fffffffffffffc30,(fdb_kvs_handle **)in_stack_fffffffffffffc28,
                        (fdb_kvs_config *)0x1194d2);
  if (local_74 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0xed4);
    auto_commit_test::__test_pass = 0;
    if (local_74 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xed4,"void auto_commit_test()");
    }
  }
  local_54 = 0;
  do {
    if (local_5c <= (int)local_54) {
      local_54 = 0;
      while( true ) {
        if (local_5c <= (int)local_54) {
          local_74 = fdb_kvs_close(in_stack_fffffffffffffc28);
          if (local_74 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xee9);
            auto_commit_test::__test_pass = 0;
            if (local_74 != FDB_RESULT_SUCCESS) {
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0xee9,"void auto_commit_test()");
            }
          }
          local_74 = fdb_close((fdb_file_handle *)in_stack_fffffffffffffc28);
          if (local_74 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xeec);
            auto_commit_test::__test_pass = 0;
            if (local_74 != FDB_RESULT_SUCCESS) {
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0xeec,"void auto_commit_test()");
            }
          }
          local_74 = fdb_open(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                              in_stack_fffffffffffffe48);
          if (local_74 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xeee);
            auto_commit_test::__test_pass = 0;
            if (local_74 != FDB_RESULT_SUCCESS) {
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0xeee,"void auto_commit_test()");
            }
          }
          local_74 = fdb_kvs_open_default
                               (in_stack_fffffffffffffc30,
                                (fdb_kvs_handle **)in_stack_fffffffffffffc28,
                                (fdb_kvs_config *)0x1199cb);
          if (local_74 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xef0);
            auto_commit_test::__test_pass = 0;
            if (local_74 != FDB_RESULT_SUCCESS) {
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0xef0,"void auto_commit_test()");
            }
          }
          local_54 = 0;
          while( true ) {
            if (local_5c <= (int)local_54) {
              local_74 = fdb_close((fdb_file_handle *)in_stack_fffffffffffffc28);
              if (local_74 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xefe);
                auto_commit_test::__test_pass = 0;
                if (local_74 != FDB_RESULT_SUCCESS) {
                  __assert_fail("status == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                ,0xefe,"void auto_commit_test()");
                }
              }
              fdb_shutdown();
              memleak_end();
              if (auto_commit_test::__test_pass == 0) {
                fprintf(_stderr,"%s FAILED\n","auto commit test");
              }
              else {
                fprintf(_stderr,"%s PASSED\n","auto commit test");
              }
              return;
            }
            sprintf((char *)local_178,"key%d",(ulong)local_54);
            sprintf(local_278,"body%d",(ulong)local_54);
            ppvVar3 = local_178;
            in_stack_fffffffffffffc28 = local_70;
            strlen((char *)local_178);
            local_74 = fdb_get_kv(in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
                                  in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
                                  (size_t *)in_stack_fffffffffffffc48);
            if (local_74 != FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xef7);
              auto_commit_test::__test_pass = 0;
              if (local_74 != FDB_RESULT_SUCCESS) {
                __assert_fail("status == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                              ,0xef7,"void auto_commit_test()");
              }
            }
            iVar1 = memcmp(local_280,local_278,local_288);
            if (iVar1 != 0) break;
            fdb_free_block((void *)0x119bd4);
            local_54 = local_54 + 1;
          }
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_278,local_280,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xef8,in_stack_fffffffffffffc28,ppvVar3);
          auto_commit_test::__test_pass = 0;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xef8,"void auto_commit_test()");
        }
        sprintf((char *)local_178,"key%d",(ulong)local_54);
        sprintf(local_278,"body%d",(ulong)local_54);
        strlen((char *)local_178);
        local_74 = fdb_get_kv(in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
                              in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
                              (size_t *)in_stack_fffffffffffffc48);
        if (local_74 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xee3);
          auto_commit_test::__test_pass = 0;
          if (local_74 != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xee3,"void auto_commit_test()");
          }
        }
        iVar1 = memcmp(local_280,local_278,local_288);
        if (iVar1 != 0) break;
        fdb_free_block((void *)0x119824);
        local_54 = local_54 + 1;
      }
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_278,local_280,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xee4);
      auto_commit_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xee4,"void auto_commit_test()");
    }
    sprintf((char *)local_178,"key%d",(ulong)local_54);
    sprintf(local_278,"body%d",(ulong)local_54);
    in_stack_fffffffffffffc50 = local_178;
    in_stack_fffffffffffffc48 = local_70;
    sVar2 = strlen((char *)local_178);
    in_stack_fffffffffffffc58 = sVar2 + 1;
    in_stack_fffffffffffffc60 = local_278;
    strlen(local_278);
    local_74 = fdb_set_kv(in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
                          in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
                          (size_t)in_stack_fffffffffffffc48);
    if (local_74 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xedb);
      auto_commit_test::__test_pass = 0;
      if (local_74 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xedb,"void auto_commit_test()");
      }
    }
    local_54 = local_54 + 1;
  } while( true );
}

Assistant:

void auto_commit_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 5000;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_status status;

    char key[256], value[256];
    void *value_out;
    size_t valuelen;

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 4096;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.durability_opt = FDB_DRB_ASYNC;
    fconfig.auto_commit = true;

    // open db
    status = fdb_open(&dbfile, "dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert docs
    for (i=0;i<n;++i){
        sprintf(key, "key%d", i);
        sprintf(value, "body%d", i);
        status = fdb_set_kv(db, key, strlen(key)+1, value, strlen(value)+1);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // retrieve check before close
    for (i=0;i<n;++i){
        sprintf(key, "key%d", i);
        sprintf(value, "body%d", i);
        status = fdb_get_kv(db, key, strlen(key)+1, &value_out, &valuelen);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(value_out, value, valuelen);
        fdb_free_block(value_out);
    }

    status = fdb_kvs_close(db);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // close & reopen
    status = fdb_close(dbfile);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_open(&dbfile, "dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // retrieve check again
    for (i=0;i<n;++i){
        sprintf(key, "key%d", i);
        sprintf(value, "body%d", i);
        status = fdb_get_kv(db, key, strlen(key)+1, &value_out, &valuelen);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(value_out, value, valuelen);
        fdb_free_block(value_out);
    }

    // free all resources
    status = fdb_close(dbfile);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("auto commit test");
}